

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-quants.c
# Opt level: O1

void quantize_row_q8_0_ref(float *x,block_q8_0 *y,int64_t k)

{
  float *pfVar1;
  int j;
  long lVar2;
  ushort uVar3;
  float fVar4;
  int8_t *piVar5;
  ulong uVar6;
  uint uVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  undefined1 auVar11 [16];
  anon_union_4_2_5fd15f10 fp32_2;
  anon_union_4_2_5fd15f10 fp32;
  float fVar12;
  
  lVar2 = k + 0x1f;
  if (-1 < k) {
    lVar2 = k;
  }
  uVar7 = (uint)(lVar2 >> 5);
  if (0 < (int)uVar7) {
    piVar5 = y->qs;
    uVar6 = 0;
    do {
      lVar2 = 0;
      fVar12 = 0.0;
      do {
        if (fVar12 <= ABS(x[lVar2])) {
          fVar12 = ABS(x[lVar2]);
        }
        lVar2 = lVar2 + 1;
      } while (lVar2 != 0x20);
      fVar12 = fVar12 / 127.0;
      fVar4 = (float)(((uint)fVar12 & 0x7f800000) + 0x7800000);
      if ((uint)((int)fVar12 * 2) < 0x71000000) {
        fVar4 = 2.0;
      }
      fVar4 = fVar4 + ABS(fVar12) * 5.192297e+33 * 7.70372e-34;
      uVar3 = (SUB42(fVar4,0) & 0xfff) + ((ushort)((uint)fVar4 >> 0xd) & 0x7c00);
      if (0xff000000 < (uint)((int)fVar12 * 2)) {
        uVar3 = 0x7e00;
      }
      y[uVar6].d = uVar3 | (ushort)((uint)fVar12 >> 0x10) & 0x8000;
      fVar12 = (float)(-(uint)(fVar12 != 0.0) & (uint)(1.0 / fVar12));
      lVar2 = 0;
      do {
        pfVar1 = x + lVar2;
        fVar4 = *pfVar1;
        fVar10 = pfVar1[1];
        fVar9 = pfVar1[2];
        fVar8 = roundf(pfVar1[3] * fVar12);
        fVar9 = roundf(fVar9 * fVar12);
        fVar4 = roundf(fVar4 * fVar12);
        fVar10 = roundf(fVar10 * fVar12);
        auVar11._0_4_ = (int)fVar4;
        auVar11._4_4_ = (int)fVar10;
        auVar11._8_4_ = (int)fVar9;
        auVar11._12_4_ = (int)fVar8;
        auVar11 = packssdw(auVar11,auVar11);
        auVar11 = packsswb(auVar11,auVar11);
        *(int *)(piVar5 + lVar2) = auVar11._0_4_;
        lVar2 = lVar2 + 4;
      } while (lVar2 != 0x20);
      uVar6 = uVar6 + 1;
      x = x + 0x20;
      piVar5 = piVar5 + 0x22;
    } while (uVar6 != (uVar7 & 0x7fffffff));
  }
  return;
}

Assistant:

void quantize_row_q8_0_ref(const float * GGML_RESTRICT x, block_q8_0 * GGML_RESTRICT y, int64_t k) {
    assert(k % QK8_0 == 0);
    const int nb = k / QK8_0;

    for (int i = 0; i < nb; i++) {
        float amax = 0.0f; // absolute max

        for (int j = 0; j < QK8_0; j++) {
            const float v = x[i*QK8_0 + j];
            amax = MAX(amax, fabsf(v));
        }

        const float d = amax / ((1 << 7) - 1);
        const float id = d ? 1.0f/d : 0.0f;

        y[i].d = GGML_FP32_TO_FP16(d);

        for (int j = 0; j < QK8_0; ++j) {
            const float x0 = x[i*QK8_0 + j]*id;

            y[i].qs[j] = roundf(x0);
        }
    }
}